

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_handler.hpp
# Opt level: O1

void wigwag::detail::
     async_handler<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::life_assurance::intrusive_life_tokens>
     ::invoke_func<CollectionOp&,int_const&,std::__cxx11::string_const&>
               (life_checker *checker,
               function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *func,CollectionOp *args,int *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict _Var2;
  undefined8 uVar3;
  execution_guard g;
  CollectionOp local_3c;
  execution_guard local_38;
  
  local_38._sd = checker->_sd;
  local_38._la = (checker->_la)._raw;
  LOCK();
  paVar1 = &(local_38._la)->_lock_counter_and_alive_flag;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  local_38._alive = _Var2 + 1 & 0x80000000;
  if (local_38._alive == 0) {
    life_assurance::intrusive_life_tokens::execution_guard::unlock(&local_38);
  }
  if (local_38._alive != 0) {
    local_3c = *args;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      life_assurance::intrusive_life_tokens::execution_guard::~execution_guard(&local_38);
      _Unwind_Resume(uVar3);
    }
    (*func->_M_invoker)((_Any_data *)func,&local_3c,args_1,args_2);
  }
  life_assurance::intrusive_life_tokens::execution_guard::~execution_guard(&local_38);
  return;
}

Assistant:

static void invoke_func(life_checker checker, const std::function<Signature_>& func, Args_&&... args)
        {
            execution_guard g(checker);
            if (g.is_alive())
                func(std::forward<Args_>(args)...);
        }